

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O3

QSize qSmartMinSize(QWidget *w)

{
  QSize QVar1;
  long in_FS_OFFSET;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_54;
  QSize local_50;
  QSize local_48;
  QSize local_40;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QSize)(**(code **)(*(long *)w + 0x70))();
  local_40 = (QSize)(**(code **)(*(long *)w + 0x78))(w);
  local_48 = QWidget::minimumSize(w);
  local_50 = QWidget::maximumSize(w);
  local_54.bits = (Bits)QWidget::sizePolicy(w);
  QVar1 = qSmartMinSize(&local_38,&local_40,&local_48,&local_50,(QSizePolicy *)&local_54.bits);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QSize qSmartMinSize(const QWidget *w)
{
    return qSmartMinSize(w->sizeHint(), w->minimumSizeHint(),
                            w->minimumSize(), w->maximumSize(),
                            w->sizePolicy());
}